

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.c++
# Opt level: O0

void __thiscall capnp::compiler::Compiler::Node::Node(Node *this,Node *parent,Reader *declaration)

{
  SegmentReader *pSVar1;
  CapTableReader *pCVar2;
  void *pvVar3;
  WirePointer *pWVar4;
  Reader declId;
  StructPointerCount SVar5;
  undefined2 uVar6;
  int iVar7;
  undefined4 uVar8;
  Which WVar9;
  uint uVar10;
  uint32_t uVar11;
  uint64_t uVar12;
  Impl *pIVar13;
  Node *pNVar14;
  size_t sVar15;
  Reader *pRVar16;
  size_t in_R8;
  StringPtr declName;
  ArrayPtr<const_char> AVar17;
  StringPtr declName_00;
  ArrayPtr<const_char> local_178;
  undefined1 local_168 [8];
  Reader name;
  Reader local_128;
  Reader local_f8;
  ArrayPtr<const_char> local_c8;
  Node *local_b8;
  char *pcStack_b0;
  Reader local_a8;
  Reader local_78;
  ArrayPtr<const_char> local_48;
  char *local_38;
  char *pcStack_30;
  Reader *local_20;
  Reader *declaration_local;
  Node *parent_local;
  Node *this_local;
  
  local_20 = declaration;
  declaration_local = (Reader *)parent;
  parent_local = this;
  Resolver::Resolver(&this->super_Resolver);
  (this->super_Resolver)._vptr_Resolver = (_func_int **)&PTR_resolve_004c2ca0;
  this->module = (CompiledModule *)(declaration_local->_reader).capTable;
  kj::Maybe<capnp::compiler::Compiler::Node_&>::Maybe(&this->parent,(Node *)declaration_local);
  pSVar1 = (local_20->_reader).segment;
  pCVar2 = (local_20->_reader).capTable;
  pvVar3 = (local_20->_reader).data;
  pWVar4 = (local_20->_reader).pointers;
  SVar5 = (local_20->_reader).pointerCount;
  uVar6 = *(undefined2 *)&(local_20->_reader).field_0x26;
  iVar7 = (local_20->_reader).nestingLimit;
  uVar8 = *(undefined4 *)&(local_20->_reader).field_0x2c;
  (this->declaration)._reader.dataSize = (local_20->_reader).dataSize;
  (this->declaration)._reader.pointerCount = SVar5;
  *(undefined2 *)&(this->declaration)._reader.field_0x26 = uVar6;
  (this->declaration)._reader.nestingLimit = iVar7;
  *(undefined4 *)&(this->declaration)._reader.field_0x2c = uVar8;
  (this->declaration)._reader.data = pvVar3;
  (this->declaration)._reader.pointers = pWVar4;
  (this->declaration)._reader.segment = pSVar1;
  (this->declaration)._reader.capTable = pCVar2;
  pNVar14 = (Node *)declaration_local[1]._reader.pointers;
  pRVar16 = local_20;
  Declaration::Reader::getName(&local_78,local_20);
  local_48 = (ArrayPtr<const_char>)LocatedText::Reader::getValue(&local_78);
  local_38 = local_48.ptr;
  pcStack_30 = (char *)local_48.size_;
  Declaration::Reader::getId(&local_a8,local_20);
  declId._reader.capTable = local_a8._reader.capTable;
  declId._reader.segment = local_a8._reader.segment;
  declId._reader.data = local_a8._reader.data;
  declId._reader.pointers = local_a8._reader.pointers;
  declId._reader.dataSize = local_a8._reader.dataSize;
  declId._reader.pointerCount = local_a8._reader.pointerCount;
  declId._reader._38_2_ = local_a8._reader._38_2_;
  declId._reader.nestingLimit = local_a8._reader.nestingLimit;
  declId._reader._44_4_ = local_a8._reader._44_4_;
  declName_00.content.size_ = (size_t)pRVar16;
  declName_00.content.ptr = pcStack_30;
  uVar12 = generateId(pNVar14,(uint64_t)local_38,declName_00,declId);
  this->id = uVar12;
  pIVar13 = CompiledModule::getCompiler((CompiledModule *)(declaration_local->_reader).capTable);
  pNVar14 = (Node *)Compiler::Impl::getNodeArena(pIVar13);
  pRVar16 = declaration_local;
  Declaration::Reader::getName(&local_f8,local_20);
  local_c8 = (ArrayPtr<const_char>)LocatedText::Reader::getValue(&local_f8);
  local_b8 = (Node *)local_c8.ptr;
  pcStack_b0 = (char *)local_c8.size_;
  declName.content.size_ = in_R8;
  declName.content.ptr = (char *)local_c8.size_;
  AVar17 = (ArrayPtr<const_char>)
           joinDisplayName(pNVar14,(Arena *)pRVar16,(Node *)local_c8.ptr,declName);
  (this->displayName).content = AVar17;
  WVar9 = Declaration::Reader::which(local_20);
  this->kind = WVar9;
  Declaration::Reader::getParameters(&local_128,local_20);
  uVar10 = List<capnp::compiler::Declaration::BrandParameter,_(capnp::Kind)3>::Reader::size
                     (&local_128);
  this->genericParamCount = uVar10;
  this->isBuiltin = false;
  Content::Content(&this->guardedContent);
  this->inGetContent = false;
  kj::Maybe<capnp::schema::Node::Reader>::Maybe(&this->loadedFinalSchema);
  Declaration::Reader::getName((Reader *)local_168,local_20);
  local_178 = (ArrayPtr<const_char>)LocatedText::Reader::getValue((Reader *)local_168);
  sVar15 = kj::StringPtr::size((StringPtr *)&local_178);
  if (sVar15 == 0) {
    uVar11 = Declaration::Reader::getStartByte(local_20);
    this->startByte = uVar11;
    uVar11 = Declaration::Reader::getEndByte(local_20);
    this->endByte = uVar11;
  }
  else {
    uVar11 = LocatedText::Reader::getStartByte((Reader *)local_168);
    this->startByte = uVar11;
    uVar11 = LocatedText::Reader::getEndByte((Reader *)local_168);
    this->endByte = uVar11;
  }
  pIVar13 = CompiledModule::getCompiler(this->module);
  uVar12 = Compiler::Impl::addNode(pIVar13,this->id,this);
  this->id = uVar12;
  return;
}

Assistant:

Compiler::Node::Node(Node& parent, const Declaration::Reader& declaration)
    : module(parent.module),
      parent(parent),
      declaration(declaration),
      id(generateId(parent.id, declaration.getName().getValue(), declaration.getId())),
      displayName(joinDisplayName(parent.module->getCompiler().getNodeArena(),
                                  parent, declaration.getName().getValue())),
      kind(declaration.which()),
      genericParamCount(declaration.getParameters().size()),
      isBuiltin(false) {
  auto name = declaration.getName();
  if (name.getValue().size() > 0) {
    startByte = name.getStartByte();
    endByte = name.getEndByte();
  } else {
    startByte = declaration.getStartByte();
    endByte = declaration.getEndByte();
  }

  id = module->getCompiler().addNode(id, *this);
}